

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_foreach_stream
              (quicly_conn_t *conn,void *thunk,_func_int_void_ptr_quicly_stream_t_ptr *cb)

{
  kh_quicly_stream_t_t *pkVar1;
  int iVar2;
  byte bVar3;
  khint_t __i;
  uint uVar4;
  
  bVar3 = 0;
  uVar4 = 0;
  while ((pkVar1 = conn->streams, iVar2 = 0, uVar4 != pkVar1->n_buckets &&
         ((((pkVar1->flags[uVar4 >> 4] >> (bVar3 & 0x1e) & 3) != 0 ||
           (pkVar1->vals[uVar4]->stream_id < 0)) ||
          (iVar2 = (*cb)(thunk,pkVar1->vals[uVar4]), iVar2 == 0))))) {
    uVar4 = uVar4 + 1;
    bVar3 = bVar3 + 2;
  }
  return iVar2;
}

Assistant:

int quicly_foreach_stream(quicly_conn_t *conn, void *thunk, int (*cb)(void *thunk, quicly_stream_t *stream))
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        if (stream->stream_id >= 0) {
            int ret = cb(thunk, stream);
            if (ret != 0)
                return ret;
        }
    });
    return 0;
}